

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

cio_error cio_linux_eventloop_add(cio_eventloop *loop,cio_event_notifier *evn)

{
  int iVar1;
  int *piVar2;
  cio_error cVar3;
  epoll_event epoll_ev;
  uint32_t local_14;
  cio_event_notifier *local_10;
  
  cVar3 = CIO_SUCCESS;
  evn->registered_events = 0;
  local_14 = 0;
  local_10 = evn;
  iVar1 = epoll_ctl(loop->epoll_fd,1,evn->fd,(epoll_event *)&local_14);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    cVar3 = -*piVar2;
  }
  return cVar3;
}

Assistant:

enum cio_error cio_linux_eventloop_add(const struct cio_eventloop *loop, struct cio_event_notifier *evn)
{
	struct epoll_event epoll_ev;
	evn->registered_events = 0;

	epoll_ev.data.ptr = evn;
	epoll_ev.events = evn->registered_events;
	if (cio_unlikely(epoll_ctl(loop->epoll_fd, EPOLL_CTL_ADD, evn->fd, &epoll_ev) < 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}